

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite_test.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::anon_unknown_0::IsEntryForFieldNumTest_Matcher_Test::
~IsEntryForFieldNumTest_Matcher_Test(IsEntryForFieldNumTest_Matcher_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(IsEntryForFieldNumTest, Matcher) {
  // clang-format off
  TcParseTable<0, 3, 0, 0, 2> table = {
      // header:
      {
          0, 0,  // has_bits_offset, extensions
          0,     // max_field_number
          0,     // fast_idx_mask,
          offsetof(decltype(table), field_lookup_table),
          0xFFFFFFFF - 7,  // 7 = fields 1, 2, and 3.
          offsetof(decltype(table), field_names),
          0,           // num_field_entries
          0, 0,        // num_aux_entries, aux_offset,
          nullptr,     // default instance
          nullptr,     // post_loop_handler
          nullptr,     // fallback function
#ifdef PROTOBUF_PREFETCH_PARSE_TABLE
          nullptr,     // to_prefetch
#endif  // PROTOBUF_PREFETCH_PARSE_TABLE
      }};
  // clang-format on
  int table_field_numbers[] = {1, 2, 3};
  table.field_lookup_table = {{65535, 65535}};

  auto& entries = table.field_entries;
  EXPECT_THAT(&entries[0], IsEntryForFieldNum(&table, 1, table_field_numbers));
  EXPECT_THAT(&entries[2], IsEntryForFieldNum(&table, 3, table_field_numbers));
  EXPECT_THAT(&entries[1],
              Not(IsEntryForFieldNum(&table, 3, table_field_numbers)));

  EXPECT_THAT(nullptr, Not(IsEntryForFieldNum(&table, 1, table_field_numbers)));
}